

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O1

Wlc_Ntk_t * Wlc_NtkDupSingleNodes(Wlc_Ntk_t *p)

{
  Wlc_Obj_t *pWVar1;
  Wlc_Obj_t *pWVar2;
  char *__s;
  int iVar3;
  uint uVar4;
  int *piVar5;
  Vec_Int_t *vFanins;
  Wlc_Ntk_t *p_00;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar6;
  ulong uVar7;
  size_t sVar8;
  char *__dest;
  ushort uVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  if (1 < p->iObj) {
    iVar10 = 1;
    if (1 < p->nObjsAlloc) {
      iVar10 = p->nObjsAlloc;
    }
    if (iVar10 - 1U <= p->iObj - 2U) {
LAB_003490ad:
      __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlc.h"
                    ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
    }
  }
  uVar4 = p->nObjsAlloc;
  if ((p->vCopies).nCap < (int)uVar4) {
    piVar5 = (p->vCopies).pArray;
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc((long)(int)uVar4 << 2);
    }
    else {
      piVar5 = (int *)realloc(piVar5,(long)(int)uVar4 << 2);
    }
    (p->vCopies).pArray = piVar5;
    if (piVar5 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vCopies).nCap = uVar4;
  }
  if (0 < (int)uVar4) {
    memset((p->vCopies).pArray,0,(ulong)uVar4 * 4);
  }
  (p->vCopies).nSize = uVar4;
  vFanins = (Vec_Int_t *)malloc(0x10);
  vFanins->nCap = 100;
  vFanins->nSize = 0;
  piVar5 = (int *)malloc(400);
  vFanins->pArray = piVar5;
  p_00 = Wlc_NtkAlloc(p->pName,p->nObjsAlloc);
  p_00->fSmtLib = p->fSmtLib;
  p_00->fAsyncRst = p->fAsyncRst;
  p_00->fMemPorts = p->fMemPorts;
  p_00->fEasyFfs = p->fEasyFfs;
  if (1 < p->iObj) {
    lVar12 = 1;
    do {
      if (p->nObjsAlloc <= lVar12) goto LAB_003490ad;
      uVar9 = *(ushort *)(p->pObjs + lVar12);
      if ((((uVar9 & 0x3d) != 1) && (uVar9 = uVar9 & 0x3f, uVar9 != 0x2d)) &&
         ((pWVar1 = p->pObjs + lVar12, uVar9 != 8 || ((int)pWVar1->nFanins < 4)))) {
        uVar7 = (ulong)pWVar1->nFanins;
        if (0 < (int)pWVar1->nFanins) {
          lVar13 = 0;
          do {
            if ((2 < (uint)uVar7) ||
               (paVar6 = &pWVar1->field_10,
               (undefined1  [24])((undefined1  [24])*pWVar1 & (undefined1  [24])0x2f) ==
               (undefined1  [24])0x6)) {
              paVar6 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar1->field_10).pFanins[0];
            }
            iVar10 = paVar6->Fanins[lVar13];
            lVar11 = (long)iVar10;
            if ((lVar11 < 1) || (p->nObjsAlloc <= iVar10)) goto LAB_003490ad;
            pWVar2 = p->pObjs;
            iVar3 = Wlc_ObjAlloc(p_00,1,*(uint *)(pWVar2 + lVar11) >> 6 & 1,pWVar2[lVar11].End,
                                 pWVar2[lVar11].Beg);
            if ((iVar3 < 1) || (p_00->nObjsAlloc <= iVar3)) goto LAB_003490ad;
            if ((p->vCopies).nSize <= iVar10) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                            ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            (p->vCopies).pArray[lVar11] = iVar3;
            lVar13 = lVar13 + 1;
            uVar7 = (ulong)(int)pWVar1->nFanins;
          } while (lVar13 < (long)uVar7);
        }
        uVar4 = Wlc_ObjDup(p_00,p,(int)lVar12,vFanins);
        if (((int)uVar4 < 1) || (p_00->nObjsAlloc <= (int)uVar4)) goto LAB_003490ad;
        *(ushort *)(p_00->pObjs + uVar4) = *(ushort *)(p_00->pObjs + uVar4) | 0x200;
        Vec_IntPush(&p_00->vPos,uVar4);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < p->iObj);
  }
  if (vFanins->pArray != (int *)0x0) {
    free(vFanins->pArray);
    vFanins->pArray = (int *)0x0;
  }
  free(vFanins);
  Wlc_NtkTransferNames(p_00,p);
  __s = p->pSpec;
  if (__s != (char *)0x0) {
    sVar8 = strlen(__s);
    __dest = (char *)malloc(sVar8 + 1);
    strcpy(__dest,__s);
    p_00->pSpec = __dest;
  }
  return p_00;
}

Assistant:

Wlc_Ntk_t * Wlc_NtkDupSingleNodes( Wlc_Ntk_t * p )
{
    Wlc_Ntk_t * pNew;
    Vec_Int_t * vFanins;
    Wlc_Obj_t * pObj, * pObjNew;
    Wlc_Obj_t * pFanin, * pFaninNew;
    int i, k, iFanin, iFaninNew, iObjNew, Count = 0;
    // count objects
    Wlc_NtkForEachObj( p, pObj, i )
        if ( !Wlc_ObjIsCi(pObj) )
            Count += 1 + Wlc_ObjFaninNum(pObj);
    // copy objects
    Wlc_NtkCleanCopy( p );
    vFanins = Vec_IntAlloc( 100 );
    pNew = Wlc_NtkAlloc( p->pName, p->nObjsAlloc );
    pNew->fSmtLib = p->fSmtLib;
    pNew->fAsyncRst = p->fAsyncRst;
    pNew->fMemPorts = p->fMemPorts;
    pNew->fEasyFfs = p->fEasyFfs;
    Wlc_NtkForEachObj( p, pObj, i )
    {
        if ( Wlc_ObjIsCi(pObj) )
            continue;
        if ( pObj->Type == WLC_OBJ_ARI_MULTI )
            continue;
        if ( pObj->Type == WLC_OBJ_MUX && Wlc_ObjFaninNum(pObj) > 3 )
            continue;
        // create CIs for the fanins
        Wlc_ObjForEachFanin( pObj, iFanin, k )
        {
            pFanin = Wlc_NtkObj(p, iFanin);
            iFaninNew = Wlc_ObjAlloc( pNew, WLC_OBJ_PI, pFanin->Signed, pFanin->End, pFanin->Beg );
            pFaninNew = Wlc_NtkObj(pNew, iFaninNew);
            Wlc_ObjSetCopy( p, iFanin, iFaninNew );
            //Wlc_ObjSetCi( pNew, pFaninNew );
        }
        // create object
        iObjNew = Wlc_ObjDup( pNew, p, i, vFanins );
        pObjNew = Wlc_NtkObj(pNew, iObjNew);
        pObjNew->fIsPo = 1;
        Vec_IntPush( &pNew->vPos, iObjNew );
    }
    Vec_IntFree( vFanins );
    Wlc_NtkTransferNames( pNew, p );
    if ( p->pSpec )
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    return pNew;
}